

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_source_get_cursor_in_pcm_frames(ma_data_source *pDataSource,ma_uint64 *pCursor)

{
  ma_result mVar1;
  ma_uint64 in_RAX;
  ma_uint64 mVar2;
  ma_uint64 cursor;
  
  if (pCursor != (ma_uint64 *)0x0) {
    *pCursor = 0;
    if (pDataSource == (ma_data_source *)0x0) {
      mVar1 = MA_SUCCESS;
    }
    else if (*(code **)(*pDataSource + 0x18) == (code *)0x0) {
      mVar1 = MA_NOT_IMPLEMENTED;
    }
    else {
      cursor = in_RAX;
      mVar1 = (**(code **)(*pDataSource + 0x18))(pDataSource,&cursor);
      if (mVar1 == MA_SUCCESS) {
        mVar1 = MA_SUCCESS;
        mVar2 = 0;
        if (*(ulong *)((long)pDataSource + 8) <= cursor) {
          mVar2 = cursor - *(ulong *)((long)pDataSource + 8);
        }
        *pCursor = mVar2;
      }
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_data_source_get_cursor_in_pcm_frames(ma_data_source* pDataSource, ma_uint64* pCursor)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_uint64 cursor;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    if (pDataSourceBase == NULL) {
        return MA_SUCCESS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    if (pDataSourceBase->vtable->onGetCursor == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pDataSourceBase->vtable->onGetCursor(pDataSourceBase, &cursor);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* The cursor needs to be made relative to the start of the range. */
    if (cursor < pDataSourceBase->rangeBegInFrames) {   /* Safety check so we don't return some huge number. */
        *pCursor = 0;
    } else {
        *pCursor = cursor - pDataSourceBase->rangeBegInFrames;
    }

    return MA_SUCCESS;
}